

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Tags::~Tags(Tags *this)

{
  int iVar1;
  Tag *pTVar2;
  Tag *this_00;
  Tag *t;
  Tags *this_local;
  
  while (0 < this->m_tags_count) {
    iVar1 = this->m_tags_count;
    this->m_tags_count = iVar1 + -1;
    Tag::Clear(this->m_tags + (long)iVar1 + -1);
  }
  pTVar2 = this->m_tags;
  if (pTVar2 != (Tag *)0x0) {
    this_00 = pTVar2 + *(long *)&pTVar2[-1].m_simple_tags_size;
    while (pTVar2 != this_00) {
      this_00 = this_00 + -1;
      Tag::~Tag(this_00);
    }
    operator_delete__(&pTVar2[-1].m_simple_tags_size);
  }
  return;
}

Assistant:

Tags::~Tags() {
  while (m_tags_count > 0) {
    Tag& t = m_tags[--m_tags_count];
    t.Clear();
  }
  delete[] m_tags;
}